

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

int xmlGetMinOccurs(xmlSchemaParserCtxtPtr ctxt,xmlNodePtr node,int min,int max,int def,
                   char *expected)

{
  byte *pbVar1;
  xmlNodePtr node_00;
  byte *expected_00;
  undefined4 in_register_0000000c;
  byte *pbVar2;
  xmlChar *unaff_RBX;
  ulong uVar3;
  int iVar4;
  int iVar5;
  xmlChar *unaff_R12;
  
  node_00 = (xmlNodePtr)xmlSchemaGetPropNode(node,"minOccurs");
  if ((node_00 != (xmlNodePtr)0x0) &&
     (expected_00 = xmlSchemaGetNodeContent(ctxt,node_00), pbVar2 = expected_00,
     expected_00 != (byte *)0x0)) {
    while( true ) {
      uVar3 = (ulong)*pbVar2;
      if (0x20 < uVar3) break;
      if ((0x100002600U >> (uVar3 & 0x3f) & 1) == 0) {
        if (uVar3 == 0) goto LAB_0019aa88;
        break;
      }
      pbVar2 = pbVar2 + 1;
    }
    iVar5 = 0;
    if ((byte)(*pbVar2 - 0x30) < 10) {
      iVar4 = 0;
      do {
        iVar5 = 0x7fffffff;
        if ((iVar4 < 0xccccccd) &&
           (iVar5 = (int)uVar3 + -0x30 + iVar4 * 10, -0x7fffffd1 - (int)uVar3 < iVar4 * 10)) {
          iVar5 = 0x7fffffff;
        }
        pbVar1 = pbVar2 + 1;
        uVar3 = (ulong)*pbVar1;
        pbVar2 = pbVar2 + 1;
        iVar4 = iVar5;
      } while ((byte)(*pbVar1 - 0x30) < 10);
    }
    while (pbVar2 = pbVar2 + 1, (byte)uVar3 < 0x21) {
      if ((0x100002600U >> (uVar3 & 0x3f) & 1) == 0) {
        if ((uVar3 == 0) && (-1 < iVar5)) {
          if (min == -1) {
            return iVar5;
          }
          if (iVar5 <= min) {
            return iVar5;
          }
        }
        break;
      }
      uVar3 = (ulong)*pbVar2;
    }
LAB_0019aa88:
    xmlSchemaPSimpleTypeErr
              (ctxt,XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,(xmlSchemaBasicItemPtr)node_00,
               (xmlNodePtr)0x0,(xmlSchemaTypePtr)CONCAT44(in_register_0000000c,max),
               (char *)expected_00,(xmlChar *)0x0,(char *)0x0,unaff_RBX,unaff_R12);
  }
  return 1;
}

Assistant:

static int
xmlGetMinOccurs(xmlSchemaParserCtxtPtr ctxt, xmlNodePtr node,
		int min, int max, int def, const char *expected)
{
    const xmlChar *val, *cur;
    int ret = 0;
    xmlAttrPtr attr;

    attr = xmlSchemaGetPropNode(node, "minOccurs");
    if (attr == NULL)
	return (def);
    val = xmlSchemaGetNodeContent(ctxt, (xmlNodePtr) attr);
    if (val == NULL)
	return (def);
    cur = val;
    while (IS_BLANK_CH(*cur))
        cur++;
    if (*cur == 0) {
        xmlSchemaPSimpleTypeErr(ctxt,
	    XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,
	    /* XML_SCHEMAP_INVALID_MINOCCURS, */
	    NULL, (xmlNodePtr) attr, NULL, expected,
	    val, NULL, NULL, NULL);
        return (def);
    }
    while ((*cur >= '0') && (*cur <= '9')) {
        if (ret > INT_MAX / 10) {
            ret = INT_MAX;
        } else {
            int digit = *cur - '0';
            ret *= 10;
            if (ret > INT_MAX - digit)
                ret = INT_MAX;
            else
                ret += digit;
        }
        cur++;
    }
    while (IS_BLANK_CH(*cur))
        cur++;
    /*
    * TODO: Restrict the maximal value to Integer.
    */
    if ((*cur != 0) || (ret < min) || ((max != -1) && (ret > max))) {
	xmlSchemaPSimpleTypeErr(ctxt,
	    XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,
	    /* XML_SCHEMAP_INVALID_MINOCCURS, */
	    NULL, (xmlNodePtr) attr, NULL, expected,
	    val, NULL, NULL, NULL);
        return (def);
    }
    return (ret);
}